

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

string * __thiscall rcg::System::getName_abi_cxx11_(string *__return_storage_ptr__,System *this)

{
  recursive_mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  TL_INFO_CMD in_R8D;
  
  __mutex = &this->mtx;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    (anonymous_namespace)::cTLGetInfo_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)this->tl,
               (this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,(shared_ptr<const_rcg::GenTLWrapper> *)0x5,in_R8D);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return __return_storage_ptr__;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

std::string System::getName()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  return cTLGetInfo(tl, gentl, GenTL::TL_INFO_NAME);
}